

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O3

bool S2::ApproxEquals(S2Point *a,S2Point *b,S1Angle max_error)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *ap;
  bool bVar4;
  double local_48 [4];
  double local_28;
  S1Angle local_20;
  S2LogMessage local_18;
  
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  lVar3 = 0;
  do {
    dVar1 = *(double *)((long)a->c_ + lVar3);
    dVar2 = *(double *)((long)local_48 + lVar3);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar4 = lVar3 != 0x10;
    lVar3 = lVar3 + 8;
  } while (bVar4);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    lVar3 = 0;
    do {
      dVar1 = *(double *)((long)b->c_ + lVar3);
      dVar2 = *(double *)((long)local_48 + lVar3);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar4 = lVar3 != 0x10;
      lVar3 = lVar3 + 8;
    } while (bVar4);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      local_28 = max_error.radians_;
      S1Angle::S1Angle(&local_20,a,b);
      return local_20.radians_ <= local_28;
    }
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x27,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_18.stream_,"Check failed: (b) != (S2Point()) ",0x21);
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x26,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_18.stream_,"Check failed: (a) != (S2Point()) ",0x21);
  }
  abort();
}

Assistant:

bool ApproxEquals(const S2Point& a, const S2Point& b, S1Angle max_error) {
  S2_DCHECK_NE(a, S2Point());
  S2_DCHECK_NE(b, S2Point());
  return S1Angle(a, b) <= max_error;
}